

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree.cpp
# Opt level: O2

void __thiscall Segtree::unlazy(Segtree *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  Segtree *pSVar5;
  Segtree *pSVar6;
  
  lVar3 = this->lazy;
  this->val = this->val + lVar3;
  iVar1 = this->l;
  iVar2 = this->r;
  if (iVar1 != iVar2) {
    pSVar5 = this->lson;
    if (pSVar5 == (Segtree *)0x0) {
      iVar4 = (iVar2 + iVar1) / 2;
      pSVar5 = (Segtree *)operator_new(0x30);
      pSVar5->INF = 1000000000000000000;
      pSVar5->l = iVar1;
      pSVar5->r = iVar4;
      pSVar5->val = 0;
      pSVar5->lazy = 0;
      pSVar5->lson = (Segtree *)0x0;
      pSVar5->rson = (Segtree *)0x0;
      this->lson = pSVar5;
      pSVar6 = (Segtree *)operator_new(0x30);
      pSVar6->INF = 1000000000000000000;
      pSVar6->l = iVar4;
      pSVar6->r = iVar2;
      pSVar6->val = 0;
      pSVar6->lazy = 0;
      pSVar6->lson = (Segtree *)0x0;
      pSVar6->rson = (Segtree *)0x0;
      this->rson = pSVar6;
    }
    else {
      pSVar6 = this->rson;
    }
    pSVar5->lazy = pSVar5->lazy + lVar3;
    pSVar6->lazy = pSVar6->lazy + this->lazy;
    this->lazy = 0;
  }
  return;
}

Assistant:

void unlazy() {
        val += lazy;
        if (l == r) return;
        if(lson == NULL) {
            int mid = (l+r)/2;
            lson = new Segtree(l, mid);
            rson = new Segtree(mid, r);
        }
        lson->lazy += lazy; // <- Propagate
        rson->lazy += lazy;
        lazy = 0;
    }